

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O1

void slider_size(t_slider *x,t_symbol *s,int ac,t_atom *av)

{
  int iVar1;
  int iVar2;
  t_float tVar3;
  t_float tVar4;
  
  tVar3 = atom_getfloatarg(0,ac,av);
  tVar4 = atom_getfloatarg(1,ac,av);
  if (x->x_orientation == horizontal) {
    iVar2 = slider_check_range(x,(int)tVar3 * ((x->x_gui).x_glist)->gl_zoom);
    (x->x_gui).x_w = iVar2;
    if (ac < 2) goto LAB_00156d2d;
    iVar2 = iemgui_clip_size((int)tVar4);
    iVar2 = iVar2 * ((x->x_gui).x_glist)->gl_zoom;
  }
  else {
    iVar1 = iemgui_clip_size((int)tVar3);
    iVar2 = ((x->x_gui).x_glist)->gl_zoom;
    (x->x_gui).x_w = iVar1 * iVar2;
    if (ac < 2) goto LAB_00156d2d;
    iVar2 = slider_check_range(x,iVar2 * (int)tVar4);
  }
  (x->x_gui).x_h = iVar2;
LAB_00156d2d:
  iemgui_size(x,&x->x_gui);
  slider_set(x,x->x_fval);
  return;
}

Assistant:

static void slider_size(t_slider *x, t_symbol *s, int ac, t_atom *av)
{
    int w = (int)atom_getfloatarg(0, ac, av);
    int h = (int)atom_getfloatarg(1, ac, av);
    if(x->x_orientation == horizontal)
    {
        x->x_gui.x_w = slider_check_range(x, w*IEMGUI_ZOOM(x));
        if(ac > 1)
            x->x_gui.x_h = iemgui_clip_size(h) * IEMGUI_ZOOM(x);
    } else {
        x->x_gui.x_w = iemgui_clip_size(w) * IEMGUI_ZOOM(x);
        if(ac > 1)
            x->x_gui.x_h = slider_check_range(x, h*IEMGUI_ZOOM(x));
    }
    iemgui_size((void *)x, &x->x_gui);
    slider_set(x, x->x_fval);
}